

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

Gia_Man_t * Gia_ManStart(int nObjsMax)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  
  if (0 < nObjsMax) {
    pGVar1 = (Gia_Man_t *)calloc(1,0x300);
    pGVar1->nObjsAlloc = nObjsMax;
    pGVar2 = (Gia_Obj_t *)calloc((ulong)(uint)nObjsMax,0xc);
    pGVar1->pObjs = pGVar2;
    *(undefined8 *)pGVar2 = 0x1fffffff1fffffff;
    pGVar1->nObjs = 1;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    uVar5 = 0x10;
    if (0xe < (uint)nObjsMax / 0x14 - 1) {
      uVar5 = (uint)nObjsMax / 0x14;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = uVar5;
    if (uVar5 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((ulong)(uVar5 * 4));
    }
    pVVar3->pArray = piVar4;
    pGVar1->vCis = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nSize = 0;
    pVVar3->nCap = uVar5;
    if (uVar5 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((ulong)(uVar5 << 2));
    }
    pVVar3->pArray = piVar4;
    pGVar1->vCos = pVVar3;
    return pGVar1;
  }
  __assert_fail("nObjsMax > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMan.c"
                ,0x37,"Gia_Man_t *Gia_ManStart(int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManStart( int nObjsMax )
{
    Gia_Man_t * p;
    assert( nObjsMax > 0 );
    p = ABC_CALLOC( Gia_Man_t, 1 );
    p->nObjsAlloc = nObjsMax;
    p->pObjs = ABC_CALLOC( Gia_Obj_t, nObjsMax );
    p->pObjs->iDiff0 = p->pObjs->iDiff1 = GIA_NONE;
    p->nObjs = 1;
    p->vCis  = Vec_IntAlloc( nObjsMax / 20 );
    p->vCos  = Vec_IntAlloc( nObjsMax / 20 );
    return p;
}